

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::ternary_each<signed_char>
          (Omega_h *this,Bytes *cond,Read<signed_char> *a,Read<signed_char> *b)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Write<signed_char> local_188;
  undefined1 local_178 [8];
  type f;
  allocator local_119;
  string local_118 [32];
  undefined1 local_f8 [8];
  Write<signed_char> c;
  int width;
  Read<signed_char> *b_local;
  Read<signed_char> *a_local;
  Bytes *cond_local;
  LO local_60;
  LO local_50;
  int local_40;
  int local_30;
  int local_20;
  int local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (int)((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (int)((ulong)(a->write_).shared_alloc_.alloc >> 3);
  }
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = (int)((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (int)((ulong)(b->write_).shared_alloc_.alloc >> 3);
  }
  if (local_10 == local_20) {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_30 = (int)((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_30 = (int)((ulong)(a->write_).shared_alloc_.alloc >> 3);
    }
    if (((ulong)(cond->write_).shared_alloc_.alloc & 1) == 0) {
      local_40 = (int)((cond->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_40 = (int)((ulong)(cond->write_).shared_alloc_.alloc >> 3);
    }
    c.shared_alloc_.direct_ptr._4_4_ = divide_no_remainder<int>(local_30,local_40);
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_50 = (LO)((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_50 = (LO)((ulong)(a->write_).shared_alloc_.alloc >> 3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"",&local_119);
    Write<signed_char>::Write((Write<signed_char> *)local_f8,local_50,(string *)local_118);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    Write<signed_char>::Write((Write<signed_char> *)local_178,(Write<signed_char> *)local_f8);
    Read<signed_char>::Read((Read<signed_char> *)&f.c.shared_alloc_.direct_ptr,cond);
    f.cond.write_.shared_alloc_.direct_ptr._0_4_ = c.shared_alloc_.direct_ptr._4_4_;
    Read<signed_char>::Read((Read<signed_char> *)&f.width,a);
    Read<signed_char>::Read((Read<signed_char> *)&f.a.write_.shared_alloc_.direct_ptr,b);
    if (((ulong)local_f8 & 1) == 0) {
      local_60 = (LO)*(size_t *)local_f8;
    }
    else {
      local_60 = (LO)((ulong)local_f8 >> 3);
    }
    parallel_for<Omega_h::ternary_each<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
              (local_60,(type *)local_178,"ternary_each");
    Write<signed_char>::Write(&local_188,(Write<signed_char> *)local_f8);
    Read<signed_char>::Read((Read<signed_char> *)this,&local_188);
    Write<signed_char>::~Write(&local_188);
    ternary_each<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)
    ::{lambda(int)#1}::~Read((_lambda_int__1_ *)local_178);
    Write<signed_char>::~Write((Write<signed_char> *)local_f8);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x137);
}

Assistant:

Read<T> ternary_each(Bytes cond, Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  auto width = divide_no_remainder(a.size(), cond.size());
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = cond[i / width] ? a[i] : b[i]; };
  parallel_for(c.size(), f, "ternary_each");
  return c;
}